

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Buffer.cxx
# Opt level: O0

void __thiscall
Fl_Text_Buffer::add_predelete_callback
          (Fl_Text_Buffer *this,Fl_Text_Predelete_Cb bufPreDeleteCB,void *cbArg)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  ulong uVar3;
  Fl_Text_Predelete_Cb *pp_Var4;
  void **ppvVar5;
  int local_34;
  int i;
  void **newCBArgs;
  Fl_Text_Predelete_Cb *newPreDeleteProcs;
  void *cbArg_local;
  Fl_Text_Predelete_Cb bufPreDeleteCB_local;
  Fl_Text_Buffer *this_local;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)(this->mNPredeleteProcs + 1);
  uVar3 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  pp_Var4 = (Fl_Text_Predelete_Cb *)operator_new__(uVar3);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (long)(this->mNPredeleteProcs + 1);
  uVar3 = SUB168(auVar2 * ZEXT816(8),0);
  if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  ppvVar5 = (void **)operator_new__(uVar3);
  for (local_34 = 0; local_34 < this->mNPredeleteProcs; local_34 = local_34 + 1) {
    pp_Var4[local_34 + 1] = this->mPredeleteProcs[local_34];
    ppvVar5[local_34 + 1] = this->mPredeleteCbArgs[local_34];
  }
  if (0 < this->mNPredeleteProcs) {
    if (this->mPredeleteProcs != (Fl_Text_Predelete_Cb *)0x0) {
      operator_delete__(this->mPredeleteProcs);
    }
    if (this->mPredeleteCbArgs != (void **)0x0) {
      operator_delete__(this->mPredeleteCbArgs);
    }
  }
  *pp_Var4 = bufPreDeleteCB;
  *ppvVar5 = cbArg;
  this->mNPredeleteProcs = this->mNPredeleteProcs + 1;
  this->mPredeleteProcs = pp_Var4;
  this->mPredeleteCbArgs = ppvVar5;
  return;
}

Assistant:

void Fl_Text_Buffer::add_predelete_callback(Fl_Text_Predelete_Cb bufPreDeleteCB, 
                                            void *cbArg)
{
  Fl_Text_Predelete_Cb *newPreDeleteProcs =
  new Fl_Text_Predelete_Cb[mNPredeleteProcs + 1];
  void **newCBArgs = new void *[mNPredeleteProcs + 1];
  for (int i = 0; i < mNPredeleteProcs; i++) {
    newPreDeleteProcs[i + 1] = mPredeleteProcs[i];
    newCBArgs[i + 1] = mPredeleteCbArgs[i];
  }
  if (mNPredeleteProcs > 0) {
    delete[] mPredeleteProcs;
    delete[] mPredeleteCbArgs;
  }
  newPreDeleteProcs[0] = bufPreDeleteCB;
  newCBArgs[0] = cbArg;
  mNPredeleteProcs++;
  mPredeleteProcs = newPreDeleteProcs;
  mPredeleteCbArgs = newCBArgs;
}